

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O2

vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
* __thiscall
mario::TimerQueue::getExpired
          (vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
           *__return_storage_ptr__,TimerQueue *this,Timestamp now)

{
  pointer ppVar1;
  iterator __last;
  vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
  *__range1;
  pointer ppVar2;
  ActiveTimer timer;
  pair<mario::Timestamp,_mario::Timer_*> sentry;
  key_type local_48;
  key_type local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.second = (Timer *)0xffffffffffffffff;
  local_38.first._microSecondsSinceEpoch = now._microSecondsSinceEpoch;
  __last = std::
           _Rb_tree<std::pair<mario::Timestamp,_mario::Timer_*>,_std::pair<mario::Timestamp,_mario::Timer_*>,_std::_Identity<std::pair<mario::Timestamp,_mario::Timer_*>_>,_std::less<std::pair<mario::Timestamp,_mario::Timer_*>_>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
           ::lower_bound(&(this->_timers)._M_t,&local_38);
  std::__copy_move<false,false,std::bidirectional_iterator_tag>::
  __copy_m<std::_Rb_tree_const_iterator<std::pair<mario::Timestamp,mario::Timer*>>,std::back_insert_iterator<std::vector<std::pair<mario::Timestamp,mario::Timer*>,std::allocator<std::pair<mario::Timestamp,mario::Timer*>>>>>
            ((this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::pair<mario::Timestamp,_mario::Timer_*>_>)__last._M_node,
             (back_insert_iterator<std::vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>_>
              )__return_storage_ptr__);
  std::
  _Rb_tree<std::pair<mario::Timestamp,_mario::Timer_*>,_std::pair<mario::Timestamp,_mario::Timer_*>,_std::_Identity<std::pair<mario::Timestamp,_mario::Timer_*>_>,_std::less<std::pair<mario::Timestamp,_mario::Timer_*>_>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
  ::_M_erase_aux(&(this->_timers)._M_t,
                 (this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (const_iterator)__last._M_node);
  ppVar1 = (__return_storage_ptr__->
           super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar2 = (__return_storage_ptr__->
                super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1) {
    local_48.first = ppVar2->second;
    local_48.second = (local_48.first)->_sequence;
    std::
    _Rb_tree<std::pair<mario::Timer_*,_long>,_std::pair<mario::Timer_*,_long>,_std::_Identity<std::pair<mario::Timer_*,_long>_>,_std::less<std::pair<mario::Timer_*,_long>_>,_std::allocator<std::pair<mario::Timer_*,_long>_>_>
    ::erase(&(this->_activeTimers)._M_t,&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TimerQueue::Entry> TimerQueue::getExpired(Timestamp now) {
    std::vector<Entry> expired;
    auto sentry = std::make_pair(now, reinterpret_cast<Timer*>(UINTPTR_MAX));
    auto it = _timers.lower_bound(sentry);
    std::copy(_timers.begin(), it, back_inserter(expired));
    _timers.erase(_timers.begin(), it);

    for (auto entry : expired) {
        ActiveTimer timer(entry.second, entry.second->sequence());
        auto n = _activeTimers.erase(timer);
    }

    return expired;
}